

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_math.cpp
# Opt level: O1

bool ON_TransformVectorList(int dim,int count,int stride,double *vector,ON_Xform *xform)

{
  double dVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  double dVar5;
  double dVar6;
  double dVar7;
  double dVar8;
  double dVar9;
  bool bVar10;
  double *pdVar11;
  
  if (dim < 1) {
    bVar10 = false;
  }
  else {
    bVar10 = vector != (double *)0x0 && (-1 < count && dim <= stride);
  }
  if (bVar10 == true && count != 0) {
    if (dim == 1) {
      do {
        *vector = xform->m_xform[0][0] * *vector;
        vector = vector + stride;
        count = count + -1;
      } while (count != 0);
    }
    else if (dim == 2) {
      pdVar11 = vector + 1;
      do {
        dVar1 = pdVar11[-1];
        dVar2 = xform->m_xform[1][1];
        dVar3 = xform->m_xform[1][0];
        pdVar11[-1] = xform->m_xform[0][0] * dVar1 + xform->m_xform[0][1] * *pdVar11;
        *pdVar11 = dVar1 * dVar3 + *pdVar11 * dVar2;
        pdVar11 = pdVar11 + stride;
        count = count + -1;
      } while (count != 0);
    }
    else {
      pdVar11 = vector + 2;
      do {
        dVar1 = pdVar11[-2];
        dVar2 = pdVar11[-1];
        dVar3 = *pdVar11;
        dVar4 = xform->m_xform[1][1];
        dVar5 = xform->m_xform[1][0];
        dVar6 = xform->m_xform[1][2];
        dVar7 = xform->m_xform[2][1];
        dVar8 = xform->m_xform[2][0];
        dVar9 = xform->m_xform[2][2];
        pdVar11[-2] = xform->m_xform[0][2] * dVar3 +
                      xform->m_xform[0][0] * dVar1 + xform->m_xform[0][1] * dVar2;
        pdVar11[-1] = dVar6 * dVar3 + dVar5 * dVar1 + dVar4 * dVar2;
        *pdVar11 = dVar3 * dVar9 + dVar1 * dVar8 + dVar2 * dVar7;
        pdVar11 = pdVar11 + stride;
        count = count + -1;
      } while (count != 0);
    }
  }
  return bVar10;
}

Assistant:

bool 
ON_IsValidPointList(
       int dim,
       bool is_rat,
       int count,
       int stride,
       const double* p
       )
{
  return ( dim > 0 && stride >= (is_rat?(dim+1):dim) && count >= 0 && p != nullptr ) ? true : false;
}